

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O1

QVersionNumber from_string(QLatin1StringView string,qsizetype *suffixIndex)

{
  qsizetype *pqVar1;
  long *in_RCX;
  long lVar2;
  qsizetype *begin;
  qsizetype *pqVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QSimpleParsedNumber<unsigned_long_long> QVar5;
  QVarLengthArray<int,_32LL> seg;
  int local_d4;
  QVLABase<int> local_d0;
  int local_b8 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_d0,0xaa,0x98);
  local_d0.super_QVLABaseBase.a = 0x20;
  local_d0.super_QVLABaseBase.s = 0;
  local_d0.super_QVLABaseBase.ptr = local_b8;
  begin = suffixIndex;
  pqVar3 = suffixIndex;
  do {
    QVar5 = qstrntoull((char *)begin,(long)(string.m_data + (long)suffixIndex) - (long)begin,10);
    lVar2 = QVar5.used;
    bVar4 = ((undefined1  [16])QVar5 & (undefined1  [16])0xffffffff80000000) ==
            (undefined1  [16])0x0;
    pqVar1 = begin;
    if (bVar4 && 0 < lVar2) {
      local_d4 = (int)QVar5.result;
      QVLABase<int>::emplace_back_impl<int>(&local_d0,0x20,local_b8,&local_d4);
      pqVar1 = (qsizetype *)((long)begin + lVar2 + 1);
      pqVar3 = (qsizetype *)((long)begin + lVar2);
    }
  } while (((bVar4 && 0 < lVar2) && pqVar1 < string.m_data + (long)suffixIndex) &&
          (begin = pqVar1, (char)*pqVar3 == '.'));
  if (in_RCX != (long *)0x0) {
    *in_RCX = (long)pqVar3 - (long)suffixIndex;
  }
  QVersionNumber::SegmentStorage::SegmentStorage
            ((SegmentStorage *)string.m_size,(int *)local_d0.super_QVLABaseBase.ptr,
             (int *)((long)local_d0.super_QVLABaseBase.ptr + local_d0.super_QVLABaseBase.s * 4));
  if ((int *)local_d0.super_QVLABaseBase.ptr != local_b8) {
    QtPrivate::sizedFree(local_d0.super_QVLABaseBase.ptr,local_d0.super_QVLABaseBase.a << 2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QVersionNumber)(anon_union_8_3_e50c5c22_for_SegmentStorage_0)string.m_size;
  }
  __stack_chk_fail();
}

Assistant:

static QVersionNumber from_string(QLatin1StringView string, qsizetype *suffixIndex)
{
    // 32 should be more than enough, and, crucially, it means we're allocating
    // not more (and often less) often when compared with direct QList usage
    // for all possible segment counts (under the constraint that we don't want
    // to keep more capacity around for the lifetime of the resulting
    // QVersionNumber than required), esp. in the common case where the inline
    // storage can be used.
    QVarLengthArray<int, 32> seg;

    const char *start = string.begin();
    const char *lastGoodEnd = start;
    const char *endOfString = string.end();

    do {
        // parsing as unsigned so a minus sign is rejected
        auto [value, used] = qstrntoull(start, endOfString - start, 10);
        if (used <= 0 || value > qulonglong(std::numeric_limits<int>::max()))
            break;
        seg.append(int(value));
        start += used + 1;
        lastGoodEnd = start - 1;
    } while (start < endOfString && *lastGoodEnd == '.');

    if (suffixIndex)
        *suffixIndex = lastGoodEnd - string.begin();

    return QVersionNumber(seg);
}